

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cali.cpp
# Opt level: O0

void cali_deactivate_channel(cali_id_t chn_id)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this;
  bool bVar1;
  ostream *poVar2;
  void *this_00;
  Log local_258;
  undefined1 local_40 [8];
  Channel channel;
  Caliper c;
  cali_id_t chn_id_local;
  
  this = &channel.mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  cali::Caliper::Caliper((Caliper *)this);
  cali::Caliper::get_channel((Caliper *)local_40,(cali_id_t)this);
  bVar1 = cali::Channel::operator_cast_to_bool((Channel *)local_40);
  if (bVar1) {
    cali::Caliper::deactivate_channel
              ((Caliper *)
               &channel.mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(Channel *)local_40);
  }
  else {
    cali::Log::Log(&local_258,0);
    poVar2 = cali::Log::stream(&local_258);
    poVar2 = std::operator<<(poVar2,"cali_deactivate_channel(): invalid channel id ");
    this_00 = (void *)std::ostream::operator<<(poVar2,chn_id);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    cali::Log::~Log(&local_258);
  }
  cali::Channel::~Channel((Channel *)local_40);
  cali::Caliper::~Caliper
            ((Caliper *)
             &channel.mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void cali_deactivate_channel(cali_id_t chn_id)
{
    Caliper c;
    Channel channel = c.get_channel(chn_id);

    if (channel)
        c.deactivate_channel(channel);
    else
        Log(0).stream() << "cali_deactivate_channel(): invalid channel id " << chn_id << std::endl;
}